

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.cpp
# Opt level: O2

void Logger::log_analysis_stage(string *message,bool newline)

{
  ostream *poVar1;
  long lVar2;
  stringstream local_1d0 [8];
  stringstream ss;
  ostream local_1c0;
  string local_48 [32];
  
  std::__cxx11::stringstream::stringstream(local_1d0);
  poVar1 = std::operator<<(&local_1c0,anon_var_dwarf_2baec1);
  poVar1 = std::operator<<(poVar1,(string *)message);
  std::operator<<(poVar1,"  ");
  lVar2 = message->_M_string_length - 0x51;
  while (lVar2 = lVar2 + 1, lVar2 != 0) {
    std::operator<<(&local_1c0,anon_var_dwarf_2baeed);
  }
  std::__cxx11::stringbuf::str();
  std::operator<<((ostream *)&instance,local_48);
  std::__cxx11::string::~string(local_48);
  std::operator<<((ostream *)&instance,"\x1b[0m");
  if (newline) {
    std::operator<<((ostream *)&instance,"\n");
  }
  std::__cxx11::stringstream::~stringstream(local_1d0);
  return;
}

Assistant:

void Logger::log_analysis_stage(const std::string &message, bool newline) {
  std::stringstream ss;
  ss << FC_CYAN_BRIGHT "████  " << message << "  ";
  // this makes sure that all log analysis stage messages have the same length
  auto remaining_chars = 80-message.length();
  while (remaining_chars--) ss << "█";
  instance.logfile << ss.str();
  instance.logfile << F_RESET;
  if (newline) instance.logfile << "\n";
}